

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<3>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<3> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  pointer pvVar5;
  void *pvVar6;
  DecodingStatus *pDVar7;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *pCVar8;
  bool bVar9;
  ulong *puVar10;
  uint32_t uVar11;
  _Elt_pointer pDVar12;
  ulong uVar13;
  pointer puVar14;
  uint32_t uVar15;
  pointer pvVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint32_t number;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus local_e0;
  uint32_t local_d0;
  DecodingStatus local_cc;
  ulong local_c0;
  uint32_t local_b8;
  uint local_b4;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
  local_a8;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  RAnsBitDecoder *local_40;
  DirectBitDecoder *local_38;
  
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e0.num_remaining_points,(allocator_type *)&local_cc);
  pvVar5 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = *(pointer *)
             ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar6 != (void *)0x0) &&
     (operator_delete(pvVar6,(long)puVar14 - (long)pvVar6),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_e0.num_remaining_points,(allocator_type *)&local_cc);
  pvVar5 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = *(pointer *)
             ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar6 != (void *)0x0) &&
     (operator_delete(pvVar6,(long)puVar14 - (long)pvVar6),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.last_axis = 0;
  local_cc.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_cc.num_remaining_points = num_points;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>>
                *)&local_a8,&local_cc);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_cc.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_cc.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_cc.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  bVar9 = true;
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_40 = &this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    local_b4 = num_points;
    local_b0 = oit;
    do {
      uVar18 = local_b4;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar7 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        uVar22 = pDVar7[0x29].num_remaining_points;
        uVar15 = pDVar7[0x29].last_axis;
        uVar4 = pDVar7[0x29].stack_pos;
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        uVar22 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_remaining_points;
        uVar15 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar4 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      pCVar8 = local_b0;
      uVar21 = (ulong)uVar4;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = pDVar12;
      if (uVar18 < uVar22) {
LAB_0019e3f1:
        bVar9 = false;
        goto LAB_0019e3f3;
      }
      uVar20 = (ulong)(uVar15 + 1);
      if (this->dimension_ - 1 == uVar15) {
        uVar20 = 0;
      }
      uVar18 = (uint)uVar20;
      if (this->dimension_ <= uVar18) goto LAB_0019e3f1;
      pvVar5 = (this->base_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = pvVar5 + uVar21;
      pvVar16 = (this->levels_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar21;
      uVar15 = *(uint32_t *)
                (*(long *)&(pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data + uVar20 * 4);
      if (this->bit_length_ == uVar15) {
        for (; uVar22 != 0; uVar22 = uVar22 - 1) {
          puVar10 = (ulong *)(pvVar1->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start;
          local_e0._0_8_ = *puVar10;
          local_e0.stack_pos = (uint32_t)puVar10[1];
          std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
          ::emplace_back<draco::VectorD<unsigned_int,3>>
                    ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                      *)(pCVar8->oit_).container,(VectorD<unsigned_int,_3> *)&local_e0);
          this->num_decoded_points_ = this->num_decoded_points_ + 1;
        }
      }
      else {
        if (2 < uVar22) {
          if (this->num_decoded_points_ <= this->num_points_) {
            uVar13 = (ulong)(uVar4 + 1);
            local_c0 = uVar20;
            local_b8 = this->bit_length_;
            local_58 = uVar13;
            local_50 = uVar21;
            local_48 = uVar21;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (pvVar5 + uVar13,pvVar1);
            piVar3 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_c0 * 4);
            *piVar3 = *piVar3 + (1 << ((char)local_b8 + ~(byte)uVar15 & 0x1f));
            iVar19 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
              }
            }
            local_d0 = 0;
            RAnsBitDecoder::DecodeLeastSignificantBits32(local_40,iVar19,&local_d0);
            iVar19 = (uVar22 >> 1) - local_d0;
            if (local_d0 <= uVar22 >> 1) {
              iVar23 = uVar22 - iVar19;
              iVar17 = iVar19;
              iVar24 = iVar19;
              if ((iVar19 != iVar23) &&
                 (puVar2 = (this->half_decoder_).pos_._M_current, iVar24 = iVar23,
                 puVar2 != (this->half_decoder_).bits_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                uVar15 = (this->half_decoder_).num_used_bits_;
                uVar22 = *puVar2;
                uVar11 = uVar15 + 1;
                (this->half_decoder_).num_used_bits_ = uVar11;
                if (uVar11 == 0x20) {
                  (this->half_decoder_).pos_._M_current = puVar2 + 1;
                  (this->half_decoder_).num_used_bits_ = 0;
                }
                if ((0x80000000U >> ((byte)uVar15 & 0x1f) & uVar22) != 0) {
                  iVar17 = iVar23;
                  iVar24 = iVar19;
                }
              }
              pvVar5 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar1 = pvVar5 + local_48;
              puVar14 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_c0;
              *puVar14 = *puVar14 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (pvVar5 + uVar13,pvVar1);
              if (iVar24 != 0) {
                local_e0.last_axis = uVar18;
                local_e0.num_remaining_points = iVar24;
                local_e0.stack_pos = (uint32_t)local_50;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
                            *)&local_a8,&local_e0);
              }
              if (iVar17 != 0) {
                local_e0.last_axis = uVar18;
                local_e0.num_remaining_points = iVar17;
                local_e0.stack_pos = (uint32_t)local_58;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
                            *)&local_a8,&local_e0);
              }
              goto LAB_0019e3d9;
            }
          }
          goto LAB_0019e3f1;
        }
        puVar14 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *puVar14 = uVar18;
        uVar21 = (ulong)this->dimension_;
        if (1 < this->dimension_) {
          uVar13 = 1;
          do {
            uVar18 = (int)uVar20 + 1;
            if ((int)uVar20 == (int)uVar21 + -1) {
              uVar18 = 0;
            }
            puVar14[uVar13] = uVar18;
            uVar13 = uVar13 + 1;
            uVar21 = (ulong)this->dimension_;
            uVar20 = (ulong)uVar18;
          } while (uVar13 < uVar21);
        }
        if (uVar22 != 0) {
          uVar18 = 0;
          do {
            puVar10 = (ulong *)(this->p_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
            if (this->dimension_ != 0) {
              puVar14 = (this->axes_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar21 = 0;
              do {
                *(uint *)((long)puVar10 + (ulong)puVar14[uVar21] * 4) = 0;
                uVar20 = (ulong)puVar14[uVar21];
                iVar19 = this->bit_length_ -
                         *(int *)(*(long *)&(pvVar16->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data + uVar20 * 4);
                if (iVar19 != 0) {
                  bVar9 = DirectBitDecoder::DecodeLeastSignificantBits32
                                    (local_38,iVar19,(uint32_t *)((long)puVar10 + uVar20 * 4));
                  if (!bVar9) goto LAB_0019e3f1;
                  puVar10 = (ulong *)(this->p_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  puVar14 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar20 = (ulong)puVar14[uVar21];
                }
                puVar2 = (uint *)((long)puVar10 + uVar20 * 4);
                *puVar2 = *puVar2 | (pvVar1->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start[uVar20];
                uVar21 = uVar21 + 1;
              } while (uVar21 < this->dimension_);
            }
            local_e0._0_8_ = *puVar10;
            local_e0.stack_pos = (uint32_t)puVar10[1];
            std::
            vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>::
            emplace_back<draco::VectorD<unsigned_int,3>>
                      ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                        *)(local_b0->oit_).container,(VectorD<unsigned_int,_3> *)&local_e0);
            this->num_decoded_points_ = this->num_decoded_points_ + 1;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar22);
        }
      }
LAB_0019e3d9:
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
    bVar9 = true;
  }
LAB_0019e3f3:
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<3>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return bVar9;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}